

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

Vec_Vec_t * Saig_ManBmcSections(Aig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *vRoots;
  void **ppvVar3;
  Vec_Vec_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong local_50;
  
  Aig_ManIncrementTravId(p);
  p->pConst1->TravId = p->nTravIds;
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 1000;
  vRoots->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  vRoots->pArray = ppvVar3;
  iVar10 = p->nTruePos;
  uVar9 = 1000;
  if (0 < iVar10) {
    lVar12 = 0;
    do {
      if (p->vCos->nSize <= lVar12) {
LAB_004f238a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = p->vCos->pArray[lVar12];
      *(int *)((long)pvVar2 + 0x20) = p->nTravIds;
      iVar8 = (int)uVar9;
      if ((int)lVar12 == iVar8) {
        if (iVar8 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vRoots->pArray,0x80);
          }
          vRoots->pArray = ppvVar3;
          vRoots->nCap = 0x10;
          uVar9 = 0x10;
        }
        else {
          uVar9 = (ulong)(uint)(iVar8 * 2);
          if (vRoots->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar9 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(vRoots->pArray,uVar9 * 8);
          }
          vRoots->pArray = ppvVar3;
          vRoots->nCap = iVar8 * 2;
        }
      }
      else {
        ppvVar3 = vRoots->pArray;
      }
      lVar7 = lVar12 + 1;
      vRoots->nSize = (int)lVar7;
      ppvVar3[lVar12] = pvVar2;
      lVar12 = lVar7;
    } while (lVar7 < p->nTruePos);
  }
  pVVar4 = (Vec_Vec_t *)malloc(0x10);
  pVVar4->nCap = 0x14;
  pVVar4->nSize = 0;
  ppvVar3 = (void **)malloc(0xa0);
  pVVar4->pArray = ppvVar3;
  if (0 < iVar10) {
    local_50 = 0x14;
    uVar11 = 0;
    do {
      pVVar5 = Saig_ManBmcDfsNodes(p,vRoots);
      uVar6 = (uint)local_50;
      if (uVar11 == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar3;
          pVVar4->nCap = 0x10;
          local_50 = 0x10;
        }
        else {
          local_50 = (ulong)(uVar6 * 2);
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(local_50 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar4->pArray,local_50 * 8);
          }
          pVVar4->pArray = ppvVar3;
          pVVar4->nCap = uVar6 * 2;
        }
      }
      else {
        ppvVar3 = pVVar4->pArray;
      }
      pVVar4->nSize = uVar11 + 1;
      ppvVar3[uVar11] = pVVar5;
      vRoots->nSize = 0;
      iVar10 = pVVar5->nSize;
      if (iVar10 < 1) break;
      lVar12 = 0;
      iVar8 = 0;
      do {
        if (((*(uint *)((long)pVVar5->pArray[lVar12] + 0x18) & 7) == 2) &&
           (iVar1 = *pVVar5->pArray[lVar12], p->nTruePis <= iVar1)) {
          uVar6 = (iVar1 - p->nTruePis) + p->nTruePos;
          if (((int)uVar6 < 0) || (p->vCos->nSize <= (int)uVar6)) goto LAB_004f238a;
          pvVar2 = p->vCos->pArray[uVar6];
          if (*(int *)((long)pvVar2 + 0x20) != p->nTravIds) {
            *(int *)((long)pvVar2 + 0x20) = p->nTravIds;
            iVar10 = (int)uVar9;
            if (iVar8 == iVar10) {
              if (iVar10 < 0x10) {
                if (vRoots->pArray == (void **)0x0) {
                  ppvVar3 = (void **)malloc(0x80);
                }
                else {
                  ppvVar3 = (void **)realloc(vRoots->pArray,0x80);
                }
                vRoots->pArray = ppvVar3;
                vRoots->nCap = 0x10;
                uVar9 = 0x10;
              }
              else {
                uVar9 = (ulong)(uint)(iVar10 * 2);
                if (vRoots->pArray == (void **)0x0) {
                  ppvVar3 = (void **)malloc(uVar9 * 8);
                }
                else {
                  ppvVar3 = (void **)realloc(vRoots->pArray,uVar9 * 8);
                }
                vRoots->pArray = ppvVar3;
                vRoots->nCap = iVar10 * 2;
              }
            }
            else {
              ppvVar3 = vRoots->pArray;
            }
            lVar7 = (long)iVar8;
            iVar8 = iVar8 + 1;
            vRoots->nSize = iVar8;
            ppvVar3[lVar7] = pvVar2;
            iVar10 = pVVar5->nSize;
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar10);
      uVar11 = uVar11 + 1;
    } while (0 < iVar8);
  }
  if (vRoots->pArray != (void **)0x0) {
    free(vRoots->pArray);
  }
  free(vRoots);
  return pVVar4;
}

Assistant:

Vec_Vec_t * Saig_ManBmcSections( Aig_Man_t * p )
{
    Vec_Ptr_t * vSects, * vRoots, * vCone;
    Aig_Obj_t * pObj, * pObjPo;
    int i;
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    // start the roots
    vRoots = Vec_PtrAlloc( 1000 );
    Saig_ManForEachPo( p, pObjPo, i )
    {
        Aig_ObjSetTravIdCurrent( p, pObjPo );
        Vec_PtrPush( vRoots, pObjPo );
    }
    // compute the cones
    vSects = Vec_PtrAlloc( 20 );
    while ( Vec_PtrSize(vRoots) > 0 )
    {
        vCone = Saig_ManBmcDfsNodes( p, vRoots );
        Vec_PtrPush( vSects, vCone );
        // get the next set of roots
        Vec_PtrClear( vRoots );
        Vec_PtrForEachEntry( Aig_Obj_t *, vCone, pObj, i )
        {
            if ( !Saig_ObjIsLo(p, pObj) )
                continue;
            pObjPo = Saig_ObjLoToLi( p, pObj );
            if ( Aig_ObjIsTravIdCurrent(p, pObjPo) )
                continue;
            Aig_ObjSetTravIdCurrent( p, pObjPo );
            Vec_PtrPush( vRoots, pObjPo );
        }
    }
    Vec_PtrFree( vRoots );
    return (Vec_Vec_t *)vSects;
}